

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::ApertureILS::getShuffledIntensityNeighbors
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  pointer *pppVar1;
  iterator iVar2;
  pointer ppVar3;
  pointer ppVar4;
  double dVar5;
  int iVar6;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  pointer ppVar7;
  long lVar8;
  Station *this_00;
  long lVar9;
  pair<int,_int> pVar10;
  _List_node_base *p_Var11;
  pair<int,_int> pVar12;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<int,_int> local_70;
  pair<int,_int> local_68;
  pair<int,_int> local_60;
  ulong local_58;
  double local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_48;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  p_Var11 = (_List_node_base *)&local_48;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)p_Var11,__x);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
      _M_size != 0) {
    local_58 = 0;
    local_60.first = 0;
    local_60.second = -1;
    local_68.first = 0;
    local_68.second = 1;
    do {
      p_Var11 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var11->_M_next
                 )->_M_impl)._M_node.super__List_node_base._M_next;
      this_00 = (Station *)p_Var11[1]._M_next;
      if (0 < this_00->max_apertures) {
        lVar9 = 0;
        pVar10 = local_68;
        pVar12 = local_60;
        do {
          dVar5 = Station::getApertureIntensity(this_00,(int)lVar9);
          if (0.0 < dVar5) {
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_70 = pVar12;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,iVar2,&local_70);
            }
            else {
              *iVar2._M_current = pVar12;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          local_50 = Station::getApertureIntensity((Station *)p_Var11[1]._M_next,(int)lVar9);
          iVar6 = Station::getMaxIntensity((Station *)p_Var11[1]._M_next);
          if (local_50 <= (double)iVar6) {
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_70 = pVar10;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,iVar2,&local_70);
            }
            else {
              *iVar2._M_current = pVar10;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          lVar9 = lVar9 + 1;
          this_00 = (Station *)p_Var11[1]._M_next;
          pVar10 = (pair<int,_int>)((long)pVar10 + 0x100000000);
          pVar12 = (pair<int,_int>)((long)pVar12 + -0x100000000);
        } while (lVar9 < this_00->max_apertures);
      }
      local_58 = local_58 + 1;
      local_68 = (pair<int,_int>)((long)local_68 + 1);
      local_60 = (pair<int,_int>)((long)local_60 + 1);
    } while (local_58 <
             local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node._M_size);
  }
  ppVar3 = (__return_storage_ptr__->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (__return_storage_ptr__->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ppVar3 != ppVar4) && (ppVar3 + 1 != ppVar4)) {
    lVar9 = 8;
    do {
      iVar6 = rand();
      lVar8 = (long)iVar6 % ((lVar9 >> 3) + 1);
      if (lVar9 != lVar8 * 8) {
        ppVar7 = ppVar3 + lVar8;
        iVar6 = *(int *)((long)&ppVar3->first + lVar9);
        *(int *)((long)&ppVar3->first + lVar9) = ppVar7->first;
        ppVar7->first = iVar6;
        iVar6 = *(int *)((long)&ppVar3->second + lVar9);
        *(int *)((long)&ppVar3->second + lVar9) = ppVar7->second;
        ppVar7->second = iVar6;
      }
      ppVar7 = (pointer)((long)&ppVar3[1].first + lVar9);
      lVar9 = lVar9 + 8;
    } while (ppVar7 != ppVar4);
  }
  while (local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var11 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_48.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var11;
  }
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > ApertureILS::getShuffledIntensityNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair<int, int>> a_list;
  list<Station*>::iterator s;
  s = stations.begin();
  for (int i = 0; i < stations.size(); i++) {
    for (int j = 0; j < (*s)->getNbApertures();j++){
      //One pair -j (-aperture) for reducing intensity
      //One pair for increasing intensity (+j)
      if ((*s)->getApertureIntensity(j) > 0)
        a_list.push_back(make_pair(i,-(j+1)));
      
      if ((*s)->getApertureIntensity(j) <= (*s)->getMaxIntensity())
        a_list.push_back(make_pair(i,(j+1)));
    }
    std::advance(s,1);
  }
  //cout << "Size neighborhood " << a_list.size()<< endl;
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}